

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_unittest.cc
# Opt level: O0

void Test_Demangle_FromFile::RunTest(void)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  istream *piVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  undefined1 local_2a8 [8];
  string demangled;
  string mangled;
  size_type tab_pos;
  string line;
  istream local_230 [8];
  ifstream f;
  undefined1 local_28 [8];
  string test_file;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 fLS::FLAGS_test_srcdir_buf_abi_cxx11_,"/src/demangle_unittest.txt");
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_230,uVar3,8);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(f.fail())");
    exit(1);
  }
  std::__cxx11::string::string((string *)&tab_pos);
  while( true ) {
    do {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_230,(string *)&tab_pos);
      bVar2 = std::ios::operator_cast_to_bool(piVar4 + *(long *)(*(long *)piVar4 + -0x18));
      if (!bVar2) {
        std::__cxx11::string::~string((string *)&tab_pos);
        std::ifstream::~ifstream(local_230);
        std::__cxx11::string::~string((string *)local_28);
        return;
      }
      uVar5 = std::__cxx11::string::empty();
    } while (((uVar5 & 1) != 0) ||
            (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&tab_pos), *pcVar6 == '#'));
    lVar7 = std::__cxx11::string::find((char)&tab_pos,9);
    if (lVar7 == -1) break;
    std::__cxx11::string::substr((ulong)((long)&demangled.field_2 + 8),(ulong)&tab_pos);
    std::__cxx11::string::substr((ulong)local_2a8,(ulong)&tab_pos);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    pcVar6 = DemangleIt(pcVar6);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2a8,pcVar6);
    if (!bVar2) {
      fprintf(_stderr,"Check failed: %s %s %s\n","demangled","==","DemangleIt(mangled.c_str())");
      exit(1);
    }
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::string::~string((string *)(demangled.field_2._M_local_buf + 8));
  }
  fprintf(_stderr,"Check failed: %s %s %s\n","string::npos","!=","tab_pos");
  exit(1);
}

Assistant:

TEST(Demangle, FromFile) {
  string test_file = FLAGS_test_srcdir + "/src/demangle_unittest.txt";
  ifstream f(test_file.c_str());  // The file should exist.
  EXPECT_FALSE(f.fail());

  string line;
  while (getline(f, line)) {
    // Lines start with '#' are considered as comments.
    if (line.empty() || line[0] == '#') {
      continue;
    }
    // Each line should contain a mangled name and a demangled name
    // separated by '\t'.  Example: "_Z3foo\tfoo"
    string::size_type tab_pos = line.find('\t');
    EXPECT_NE(string::npos, tab_pos);
    string mangled = line.substr(0, tab_pos);
    string demangled = line.substr(tab_pos + 1);
    EXPECT_EQ(demangled, DemangleIt(mangled.c_str()));
  }
}